

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::Session::run(Session *this)

{
  int iVar1;
  ostream *poVar2;
  long in_RDI;
  int exitCode;
  Session *in_stack_00000368;
  
  if ((*(uint *)(in_RDI + 0xc0) & 1) != 0) {
    poVar2 = cout();
    poVar2 = std::operator<<(poVar2,"...waiting for enter/ return before starting\n");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    getchar();
  }
  iVar1 = runInternal(in_stack_00000368);
  if ((*(uint *)(in_RDI + 0xc0) & 2) != 0) {
    poVar2 = cout();
    poVar2 = std::operator<<(poVar2,"...waiting for enter/ return before exiting, with code: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,'\n');
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    getchar();
  }
  return iVar1;
}

Assistant:

int Session::run() {
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeStart ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before starting\n" << std::flush;
            static_cast<void>(std::getchar());
        }
        int exitCode = runInternal();
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeExit ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before exiting, with code: " << exitCode << '\n' << std::flush;
            static_cast<void>(std::getchar());
        }
        return exitCode;
    }